

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  uint32_t uVar2;
  int *ptr;
  int iVar3;
  int iVar4;
  uint uVar5;
  VP8StatusCode VVar6;
  uint uVar7;
  ChunkData *pCVar8;
  char *pcVar9;
  uint uVar10;
  WebPInfoStatus WVar11;
  uint32_t *puVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ChunkData *chunk_data;
  ulong uVar18;
  ulong uVar19;
  WebPInfo *webp_info_00;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  WebPInfo webp_info;
  uint8_t *data;
  size_t size;
  undefined8 local_128;
  undefined8 uStack_120;
  uint local_118 [8];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ChunkData *pCStack_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  undefined8 uStack_b0;
  int local_9c;
  undefined8 local_98;
  uint local_90;
  int local_8c;
  int local_88;
  uint local_84;
  int local_80;
  uint local_7c;
  undefined8 local_78;
  uint local_70;
  uint local_6c;
  int local_68;
  char **local_40;
  ulong local_38;
  
  local_9c = argc;
  local_40 = argv;
  if (argc != 1) {
    if (argc < 2) {
      local_80 = 0;
      uVar17 = 1;
      local_88 = 0;
      local_8c = 0;
      local_84 = 0;
LAB_00102c81:
      if ((int)uVar17 != local_9c) {
        if (local_9c <= (int)uVar17) {
          return 0;
        }
        uVar17 = uVar17 & 0xffffffff;
        do {
          local_c8 = 0;
          iStack_c4 = 0;
          local_d8._0_4_ = 0;
          local_d8._4_4_ = 0;
          pCStack_d0 = (ChunkData *)0x0;
          local_e8 = 0;
          uStack_e0._0_4_ = 0;
          uStack_e0._4_4_ = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          local_118[4] = 0;
          local_118[5] = 0;
          local_118[6] = 0;
          local_118[7] = 0;
          local_118[0] = 0;
          local_118[1] = 0;
          local_118[2] = 0;
          local_118[3] = 0;
          local_128 = (int *)0x0;
          uStack_120 = 0;
          iStack_c0 = 0;
          iVar3 = iStack_c0;
          iStack_c0 = 0;
          iStack_bc = local_80;
          iStack_b4 = local_8c;
          local_b8 = local_88;
          uStack_b0 = (ulong)local_84 << 0x20;
          pcVar9 = local_40[uVar17];
          if ((pcVar9 == (char *)0x0) ||
             (iVar4 = ImgIoUtilReadFile(pcVar9,(uint8_t **)&local_78,&local_38), uVar19 = local_38,
             ptr = local_78, iVar3 = iStack_c0, iVar4 == 0)) {
            iStack_c0 = iVar3;
            fprintf(_stderr,"Failed to open input file %s.\n",pcVar9);
            iVar3 = 1;
          }
          else {
            if (iStack_bc == 0) {
              printf("File: %s\n",pcVar9);
            }
            if (uVar19 < 0x14) {
              bVar23 = local_b8 == 0;
            }
            else if ((*ptr == 0x46464952) && (ptr[2] == 0x50424557)) {
              uVar7 = ptr[1];
              if ((ulong)uVar7 < 8) {
                bVar23 = local_b8 == 0;
              }
              else if (uVar7 < 0xfffffff7) {
                uVar18 = (ulong)uVar7 + 8;
                if (iStack_bc == 0) {
                  puts("RIFF HEADER:");
                  printf("  File size: %6d\n",uVar18 & 0xffffffff);
                }
                if (uVar18 < uVar19) {
                  if (local_b8 != 0) {
                    main_cold_1();
                  }
                  uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                  uVar19 = uVar18;
LAB_00102f0c:
                  uVar18 = 0xc;
LAB_00102f17:
                  if (uVar19 == uVar18) {
                    if (iStack_b4 != 0) {
                      puts("Summary:");
                      printf("Number of frames: %d\n",uStack_120 >> 0x20);
                      puts(
                          "Chunk type  :  VP8 VP8L VP8X ALPH ANIM ANMF(VP8 /VP8L/ALPH) ICCP EXIF  XMP"
                          );
                      printf("Chunk counts: ");
                      lVar15 = 0;
                      do {
                        printf("%4d ",(ulong)local_118[lVar15]);
                        if (lVar15 == 5) {
                          printf("%4d %4d %4d  ",local_f8 >> 0x20,uStack_f0 & 0xffffffff,
                                 uStack_f0 >> 0x20);
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 != 9);
                      putchar(10);
                    }
                    uVar19 = local_e8;
                    if (uStack_120._4_4_ < 1) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    iVar3 = 0;
                    if (local_118[2] == 0) {
                      pcVar9 = "No error detected.";
                      goto LAB_00102df7;
                    }
                    uVar7 = local_e8._4_4_;
                    bVar13 = (byte)(local_e8 >> 0x20);
                    if ((local_e8 & 0x1000000000) == 0) {
                      if ((uint)uStack_e0 != 0) {
                        bVar23 = local_b8 == 0;
                        goto joined_r0x00103f7e;
                      }
                    }
                    else if ((uint)uStack_e0 == 0) {
                      if (local_b8 != 0) {
                        main_cold_30();
                      }
                      uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                    }
                    if ((local_118[6] == 0 & bVar13 >> 5) == 1) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if ((local_118[7] == 0 & bVar13 >> 3) == 1) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if (((int)local_f8 == 0 & bVar13 >> 2) == 1) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if ((char)((uVar7 & 0x20) >> 5) == '\0' && local_118[6] != 0) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if ((char)((uVar7 & 8) >> 3) == '\0' && local_118[7] != 0) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if ((char)((uVar7 & 4) >> 2) == '\0' && (int)local_f8 != 0) {
                      bVar23 = local_b8 == 0;
                      goto joined_r0x00103f7e;
                    }
                    if (local_c8 == 0) {
                      if ((uVar19 & 0x200000000) == 0) {
                        pcVar9 = "No error detected.";
                        iVar3 = 0;
                        if (uStack_120._4_4_ < 2) goto LAB_00102df7;
                      }
                      else if (local_118[4] != 0) {
                        pcVar9 = "No error detected.";
                        if (local_118[5] != 0) goto LAB_00102df7;
                      }
                      pcVar9 = "Errors detected.";
                      iVar3 = 1;
                      if (local_b8 == 0) goto LAB_00102df7;
                      goto LAB_00103f84;
                    }
                    pcVar9 = "Errors detected.";
                    iVar3 = 1;
                    goto LAB_00102df7;
                  }
                  if (uVar19 - uVar18 < 8) {
                    bVar23 = local_b8 == 0;
                  }
                  else {
                    uVar7 = *(uint *)((long)ptr + uVar18 + 4);
                    if (uVar7 < 0xfffffff7) {
                      lVar15 = uVar18 + 8;
                      uVar5 = uVar7 & 1;
                      uVar22 = (ulong)(uVar5 + uVar7);
                      if (uVar22 <= uVar19 - lVar15) {
                        uVar7 = uVar5 + uVar7 + 8;
                        chunk_data = (ChunkData *)(ulong)uVar7;
                        puVar12 = kWebPChunkTags;
                        lVar21 = 0;
                        while (*puVar12 != *(uint32_t *)((long)ptr + uVar18)) {
                          lVar21 = lVar21 + -1;
                          puVar12 = puVar12 + 1;
                          if (lVar21 == -9) goto LAB_00102fb2;
                        }
                        if (lVar21 == -5) {
                          if (uVar5 != 0) {
                            bVar23 = local_b8 == 0;
                            goto joined_r0x00103f7e;
                          }
                          uVar14 = uVar18 + 0x18;
                          uVar22 = 5;
                        }
                        else {
                          uVar14 = uVar22 + lVar15;
                          if (lVar21 == -9) goto LAB_00102fb2;
                          uVar22 = -lVar21;
                        }
                        uVar5 = (uint)uVar22;
                        uVar22 = uVar22 & 0xffffffff;
                        if (iStack_bc == 0) {
                          uVar2 = kWebPChunkTags[uVar22];
                          local_98 = uVar22;
                          printf("Chunk %c%c%c%c at offset %6d, length %6d\n",
                                 (ulong)(uint)(int)(char)uVar2,(ulong)(uint)(int)(char)(uVar2 >> 8),
                                 (ulong)(uint)(int)(char)(uVar2 >> 0x10),
                                 (ulong)(uint)((int)uVar2 >> 0x18),uVar18,uVar7);
                          uVar22 = local_98;
                        }
                        WVar11 = WEBP_INFO_OK;
                        if (8 < uVar5) goto LAB_00102ffc;
                        webp_info_00 = (WebPInfo *)(lVar15 + (long)ptr);
                        switch((long)&switchD_001030d7::switchdataD_00128010 +
                               (long)(int)(&switchD_001030d7::switchdataD_00128010)[uVar22]) {
                        case 0x1030d9:
                          VVar6 = WebPGetFeaturesInternal
                                            ((uint8_t *)((long)ptr + uVar18),(size_t)chunk_data,
                                             (WebPBitstreamFeatures *)&local_78,0x209);
                          if (VVar6 != VP8_STATUS_OK) {
                            WVar11 = WEBP_INFO_BITSTREAM_ERROR;
                            if (local_b8 != 0) {
                              main_cold_21();
LAB_00103879:
                              WVar11 = WEBP_INFO_BITSTREAM_ERROR;
                            }
                            goto LAB_00102ffc;
                          }
                          local_98 = uVar22;
                          if (iStack_bc == 0) {
                            printf("  Width: %d\n  Height: %d\n  Alpha: %d\n  Animation: %d\n  Format: %s (%d)\n"
                                   ,(ulong)local_78 & 0xffffffff,(ulong)local_78 >> 0x20,
                                   (ulong)local_70,(ulong)local_6c,
                                   kFormats_rel + *(int *)(kFormats_rel + (long)local_68 * 4),
                                   local_68);
                          }
                          if (local_c8 == 0) {
                            if (local_118[1] == 0 && local_118[0] == 0) {
                              if ((uVar5 == 1) && (local_118[3] != 0)) {
                                if (local_b8 != 0) {
                                  main_cold_26();
                                }
                                uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                              }
                              if (local_118[5] == 0 && local_118[4] == 0) {
                                if (local_118[2] == 0) {
                                  local_128 = local_78;
                                  if ((((int)local_78 + 0xfeffffffU < 0xff000000) ||
                                      (local_78._4_4_ + 0xfeffffff < 0xff000000)) ||
                                     (0x100000000 <
                                      (ulong)local_78._4_4_ * ((ulong)local_78 & 0xffffffff))) {
                                    if (local_b8 != 0) {
                                      main_cold_29();
                                    }
                                    uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                                  }
                                }
                                else if (((uint)local_128 != (int)local_78) ||
                                        (local_128._4_4_ != local_78._4_4_)) {
                                  WVar11 = WEBP_INFO_PARSE_ERROR;
                                  if (local_b8 != 0) {
                                    main_cold_28();
                                    goto LAB_001038bb;
                                  }
                                  goto LAB_00102ffc;
                                }
                                local_118[local_98] = local_118[local_98] + 1;
LAB_001039d6:
                                uStack_120 = CONCAT44(uStack_120._4_4_ + 1,(int)uStack_120);
                                uStack_e0._0_4_ = (uint)uStack_e0 | local_70;
                                if (uStack_b0._4_4_ == 0) goto LAB_001038cf;
                                if (uVar5 == 0) {
                                  WVar11 = ParseLossyHeader(chunk_data,webp_info_00);
                                }
                                else {
                                  WVar11 = ParseLosslessHeader(chunk_data,webp_info_00);
                                }
                                if (WVar11 != WEBP_INFO_OK) goto LAB_00102ffc;
                                goto LAB_001038cf;
                              }
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_27();
                            }
                            else {
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_25();
                            }
                          }
                          else {
                            piVar1 = (int *)((long)&local_f8 + (ulong)(uVar5 != 0) * 4 + 4);
                            *piVar1 = *piVar1 + 1;
                            if ((uVar5 == 1) && (iStack_c4 != 0)) {
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_22();
                            }
                            else {
                              if (uStack_e0._4_4_ == (int)local_78) {
                                if ((int)local_d8 == local_78._4_4_) {
                                  if (iStack_c0 == 0) {
                                    iStack_c0 = 1;
                                    goto LAB_001039d6;
                                  }
                                  WVar11 = WEBP_INFO_PARSE_ERROR;
                                  if (local_b8 != 0) {
                                    main_cold_24();
                                    goto LAB_001038bb;
                                  }
                                  goto LAB_00102ffc;
                                }
                              }
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_23();
                            }
                          }
LAB_001038bb:
                          WVar11 = WEBP_INFO_PARSE_ERROR;
                          goto LAB_00102ffc;
                        case 0x103124:
                          local_118[uVar22] = local_118[uVar22] + 1;
                          goto LAB_00102ffc;
                        case 0x103134:
                          if (local_118[2] == 0) {
                            WVar11 = WEBP_INFO_PARSE_ERROR;
                            if (local_b8 != 0) {
                              main_cold_6();
                              goto LAB_00103614;
                            }
                            goto LAB_00102ffc;
                          }
                          if (uVar7 == 0xe) {
                            uVar7 = webp_info_00->canvas_width_;
                            local_e8 = CONCAT44(local_e8._4_4_,uVar7);
                            uStack_120 = CONCAT44(uStack_120._4_4_,
                                                  (uint)(ushort)webp_info_00->canvas_height_);
                            local_118[4] = local_118[4] + 1;
                            WVar11 = WEBP_INFO_OK;
                            if (iStack_bc != 0) goto LAB_00102ffc;
                            printf("  Background color:(ARGB) %02x %02x %02x %02x\n",
                                   (ulong)(uVar7 >> 0x18),(ulong)(uVar7 >> 0x10 & 0xff),
                                   (ulong)(uVar7 >> 8 & 0xff),(ulong)(uVar7 & 0xff));
                            printf("  Loop count      : %d\n",uStack_120 & 0xffffffff);
                            if (0x10000 < (int)uStack_120) {
                              if (local_b8 != 0) {
                                main_cold_5();
                              }
                              uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                            }
LAB_001038cf:
                            WVar11 = WEBP_INFO_OK;
                            goto LAB_00102ffc;
                          }
                          WVar11 = WEBP_INFO_PARSE_ERROR;
                          if (local_b8 == 0) goto LAB_00102ffc;
                          main_cold_4();
                          break;
                        case 0x1031e3:
                          if (((local_118[0] != 0) || (local_118[1] != 0)) || (local_118[2] != 0)) {
                            WVar11 = WEBP_INFO_PARSE_ERROR;
                            if (local_b8 != 0) {
                              main_cold_17();
LAB_00103614:
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                            }
                            goto LAB_00102ffc;
                          }
                          if (uVar7 == 0x12) {
                            local_118[2] = 1;
                            bVar13 = (byte)webp_info_00->canvas_width_;
                            local_e8 = (ulong)CONCAT14(bVar13,(uint32_t)local_e8);
                            iVar3 = (uint)*(ushort *)((long)&webp_info_00->canvas_height_ + 3) +
                                    (uint)*(byte *)((long)&webp_info_00->loop_count_ + 1) * 0x10000
                                    + 1;
                            local_128 = (int *)CONCAT44(iVar3,(uint)(ushort)webp_info_00->
                                                                            canvas_height_ +
                                                              (uint)*(byte *)((long)&webp_info_00->
                                                                                     canvas_height_
                                                                             + 2) * 0x10000 + 1);
                            if (iStack_bc == 0) {
                              printf("  ICCP: %d\n  Alpha: %d\n  EXIF: %d\n  XMP: %d\n  Animation: %d\n"
                                     ,(ulong)(bVar13 >> 5 & 1),(ulong)(bVar13 >> 4 & 1),
                                     (ulong)(bVar13 >> 3 & 1),(ulong)(bVar13 >> 2 & 1),
                                     (ulong)(bVar13 >> 1 & 1));
                              printf("  Canvas size %d x %d\n",(ulong)local_128 & 0xffffffff,
                                     (ulong)local_128 >> 0x20);
                              if (0x1000000 < (int)(uint)local_128) {
                                if (local_b8 != 0) {
                                  main_cold_19();
                                }
                                uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                              }
                              iVar3 = local_128._4_4_;
                              if (0x1000000 < (int)local_128._4_4_) {
                                if (local_b8 != 0) {
                                  fprintf(_stderr,"Warning: %s\n",
                                          "Canvas height is out of range in VP8X chunk.");
                                }
                                uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                                iVar3 = local_128._4_4_;
                              }
                            }
                            WVar11 = WEBP_INFO_OK;
                            if (0x100000000 < (ulong)((long)iVar3 * (long)(int)(uint)local_128)) {
                              if (local_b8 != 0) {
                                main_cold_20();
                              }
                              WVar11 = WEBP_INFO_OK;
                              uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                            }
                            goto LAB_00102ffc;
                          }
                          WVar11 = WEBP_INFO_PARSE_ERROR;
                          if (local_b8 == 0) goto LAB_00102ffc;
                          main_cold_18();
                          break;
                        case 0x10330c:
                          if (local_c8 == 0) {
                            if (local_118[5] == 0 && local_118[4] == 0) {
                              if (local_118[2] == 0) {
                                WVar11 = WEBP_INFO_PARSE_ERROR;
                                if (local_b8 == 0) goto LAB_00102ffc;
                                main_cold_16();
                              }
                              else if (local_118[0] == 0) {
                                if (local_118[3] == 0) {
                                  local_118[3] = 1;
                                  goto LAB_00103a19;
                                }
                                WVar11 = WEBP_INFO_PARSE_ERROR;
                                if (local_b8 == 0) goto LAB_00102ffc;
                                main_cold_11();
                              }
                              else {
                                WVar11 = WEBP_INFO_PARSE_ERROR;
                                if (local_b8 == 0) goto LAB_00102ffc;
                                main_cold_10();
                              }
                            }
                            else {
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_9();
                            }
                          }
                          else {
                            uStack_f0 = CONCAT44(uStack_f0._4_4_ + 1,(int)uStack_f0);
                            if (iStack_c4 == 0) {
                              iStack_c4 = 1;
                              if (iStack_c0 == 0) {
LAB_00103a19:
                                uStack_e0._0_4_ = 1;
                                WVar11 = WEBP_INFO_OK;
                                if (uStack_b0._4_4_ == 0) goto LAB_00102ffc;
                                if ((uVar7 & 0xfffffffe) == 8) {
                                  WVar11 = WEBP_INFO_TRUNCATED_DATA;
                                  if (local_b8 != 0) {
                                    main_cold_15();
                                    WVar11 = WEBP_INFO_TRUNCATED_DATA;
                                  }
                                  goto LAB_00102ffc;
                                }
                                puts("  Parsing ALPH chunk...");
                                bVar13 = (byte)webp_info_00->canvas_width_;
                                local_90 = (uint)bVar13;
                                local_98 = CONCAT44(local_98._4_4_,local_90) & 0xffffffff00000003;
                                uVar18 = (ulong)(bVar13 >> 2 & 3);
                                uVar5 = bVar13 >> 4 & 3;
                                printf("  Compression:      %d\n",(ulong)(local_90 & 3));
                                printf("  Filter:           %s (%d)\n",
                                       kAlphaFilterMethods_rel +
                                       *(int *)(kAlphaFilterMethods_rel + uVar18 * 4),uVar18);
                                printf("  Pre-processing:   %d\n",(ulong)uVar5);
                                uVar7 = (uint)local_98;
                                if (1 < (uint)local_98) {
                                  WVar11 = WEBP_INFO_BITSTREAM_ERROR;
                                  if (local_b8 != 0) {
                                    main_cold_14();
                                    goto LAB_00103879;
                                  }
                                  goto LAB_00102ffc;
                                }
                                if (1 < uVar5) {
                                  if (local_b8 != 0) {
                                    main_cold_13();
                                  }
                                  WVar11 = WEBP_INFO_BITSTREAM_ERROR;
                                  goto LAB_00102ffc;
                                }
                                if (0x3f < (byte)local_90) {
                                  if (local_b8 != 0) {
                                    main_cold_12();
                                  }
                                  uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
                                }
                                if (uVar7 == 1) {
                                  local_78 = (int *)0x0;
                                  WVar11 = ParseLosslessTransform
                                                     ((WebPInfo *)&local_128,
                                                      (uint8_t *)
                                                      ((long)&webp_info_00->canvas_width_ + 1),
                                                      (size_t)((long)&chunk_data[-1].payload_ + 7),
                                                      &local_78);
                                  if (WVar11 == WEBP_INFO_OK) goto LAB_001038cf;
                                  goto LAB_00102ffc;
                                }
                                goto LAB_001038cf;
                              }
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_8();
                            }
                            else {
                              WVar11 = WEBP_INFO_PARSE_ERROR;
                              if (local_b8 == 0) goto LAB_00102ffc;
                              main_cold_7();
                            }
                          }
                          break;
                        case 0x103353:
                          if (local_c8 != 0) {
                            bVar23 = local_b8 == 0;
                            goto joined_r0x00103f7e;
                          }
                          if (local_118[4] == 0) {
                            bVar23 = local_b8 == 0;
                            goto joined_r0x00103f7e;
                          }
                          if (uVar7 < 0x19) goto LAB_00103d99;
                          uVar20 = (uint)(uint3)webp_info_00->canvas_width_;
                          uVar5 = uVar20 * 2;
                          uVar16 = (uint)*(uint3 *)((long)&webp_info_00->canvas_width_ + 3);
                          uVar10 = (uint)(byte)webp_info_00->loop_count_ * 0x10000 +
                                   (uint)*(ushort *)((long)&webp_info_00->canvas_height_ + 2) + 1;
                          bVar13 = *(byte *)((long)&webp_info_00->num_frames_ + 3);
                          local_118[5] = local_118[5] + 1;
                          iVar3 = (uint)*(ushort *)((long)&webp_info_00->loop_count_ + 1) +
                                  (uint)*(byte *)((long)&webp_info_00->loop_count_ + 3) * 0x10000 +
                                  1;
                          uVar7 = uVar16 * 2;
                          if (iStack_bc == 0) {
                            local_98 = CONCAT44(local_98._4_4_,iVar3);
                            local_90 = uVar5;
                            local_7c = uVar10;
                            printf("  Offset_X: %d\n  Offset_Y: %d\n  Width: %d\n  Height: %d\n  Duration: %d\n  Dispose: %d\n  Blend: %d\n"
                                   ,(ulong)uVar5,(ulong)uVar7,(ulong)uVar10,iVar3,
                                   (ulong)(uint3)webp_info_00->num_frames_,bVar13 & 1,
                                   bVar13 >> 1 & 1);
                            iVar3 = (uint)local_98;
                            uVar10 = local_7c;
                            uVar5 = local_90;
                          }
                          if ((0x800000 < uVar20) || (0x800000 < uVar16)) {
                            bVar23 = local_b8 == 0;
                            goto joined_r0x00103f7e;
                          }
                          if (((uint)local_128 < uVar5 + uVar10) ||
                             (local_128._4_4_ < uVar7 + iVar3)) {
                            bVar23 = local_b8 == 0;
                            goto joined_r0x00103f7e;
                          }
                          local_c8 = 1;
                          iStack_c4 = 0;
                          iStack_c0 = 0;
                          uStack_e0._4_4_ = uVar10;
                          local_d8._0_4_ = iVar3;
                          pCStack_d0 = (ChunkData *)&chunk_data[-1].size_;
                          WVar11 = WEBP_INFO_OK;
                          goto LAB_00103036;
                        case 0x1034cb:
                          if (local_118[2] == 0) {
                            WVar11 = WEBP_INFO_PARSE_ERROR;
                            if (local_b8 == 0) goto LAB_00102ffc;
                            main_cold_3();
                          }
                          else {
                            if (((local_118[0] == 0) && (local_118[1] == 0)) && (local_118[4] == 0))
                            {
                              local_118[6] = local_118[6] + 1;
                              WVar11 = WEBP_INFO_OK;
                              goto LAB_00102ffc;
                            }
                            WVar11 = WEBP_INFO_PARSE_ERROR;
                            if (local_b8 == 0) goto LAB_00102ffc;
                            main_cold_2();
                          }
                        }
                        WVar11 = WEBP_INFO_PARSE_ERROR;
                        goto LAB_00102ffc;
                      }
                      bVar23 = local_b8 == 0;
                    }
                    else {
                      bVar23 = local_b8 == 0;
                    }
                  }
                  goto joined_r0x00103f7e;
                }
                if (uVar18 <= uVar19) goto LAB_00102f0c;
                bVar23 = local_b8 == 0;
              }
              else {
                bVar23 = local_b8 == 0;
              }
            }
            else {
              bVar23 = local_b8 == 0;
            }
joined_r0x00103f7e:
            pcVar9 = "Errors detected.";
            iVar3 = 1;
            if (!bVar23) {
LAB_00103f84:
              main_cold_31();
LAB_00103f8f:
              pcVar9 = "Errors detected.";
              iVar3 = 1;
            }
LAB_00102df7:
            if (iStack_bc == 0) {
              puts(pcVar9);
              if (0 < (int)uStack_b0) {
                printf("There were %d warning(s).\n");
              }
            }
            WebPFree(ptr);
          }
          uVar17 = uVar17 + 1;
          if (local_9c <= (int)uVar17) {
            return iVar3;
          }
        } while( true );
      }
    }
    else {
      local_84 = 0;
      uVar17 = 1;
      local_8c = 0;
      local_88 = 0;
      local_80 = 0;
      do {
        pcVar9 = local_40[uVar17];
        if (*pcVar9 == '-') {
          if ((((pcVar9[1] == 'h') && (pcVar9[2] == '\0')) ||
              (iVar3 = strcmp(pcVar9,"-help"), iVar3 == 0)) ||
             ((pcVar9[1] == 'H' && (pcVar9[2] == '\0')))) goto LAB_00102cb1;
        }
        else {
          iVar3 = strcmp(pcVar9,"-help");
          if (iVar3 == 0) goto LAB_00102cb1;
        }
        iVar3 = strcmp(pcVar9,"-longhelp");
        if (iVar3 == 0) {
LAB_00102cb1:
          puts(
              "Usage: webpinfo [options] in_files\nNote: there could be multiple input files;\n      options must come before input files.\nOptions:\n  -version ........... Print version number and exit.\n  -quiet ............. Do not show chunk parsing information.\n  -diag .............. Show parsing error diagnosis.\n  -summary ........... Show chunk stats summary.\n  -bitstream_info .... Parse bitstream header."
              );
          return 0;
        }
        iVar3 = strcmp(pcVar9,"-quiet");
        if (iVar3 == 0) {
          local_80 = 1;
        }
        else {
          iVar3 = strcmp(pcVar9,"-diag");
          if (iVar3 == 0) {
            local_88 = 1;
          }
          else {
            iVar3 = strcmp(pcVar9,"-summary");
            if (iVar3 == 0) {
              local_8c = 1;
            }
            else {
              iVar3 = strcmp(pcVar9,"-bitstream_info");
              if (iVar3 != 0) {
                iVar3 = strcmp(pcVar9,"-version");
                if (iVar3 == 0) {
                  uVar7 = WebPGetDecoderVersion();
                  printf("WebP Decoder version: %d.%d.%d\n",(ulong)(uVar7 >> 0x10 & 0xff),
                         (ulong)(uVar7 >> 8 & 0xff),(ulong)(uVar7 & 0xff));
                  return 0;
                }
                goto LAB_00102c81;
              }
              local_84 = 1;
            }
          }
        }
        uVar17 = uVar17 + 1;
      } while ((uint)argc != uVar17);
    }
  }
  puts(
      "Usage: webpinfo [options] in_files\nNote: there could be multiple input files;\n      options must come before input files.\nOptions:\n  -version ........... Print version number and exit.\n  -quiet ............. Do not show chunk parsing information.\n  -diag .............. Show parsing error diagnosis.\n  -summary ........... Show chunk stats summary.\n  -bitstream_info .... Parse bitstream header."
      );
  return 1;
LAB_00102fb2:
  uVar14 = uVar22 + lVar15;
  snprintf((char *)&local_78,0x32,"Unknown chunk at offset %6d, length %6d",uVar18 & 0xffffffff,
           chunk_data);
  if (local_b8 != 0) {
    fprintf(_stderr,"Warning: %s\n",&local_78);
  }
  uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 + 1);
  WVar11 = WEBP_INFO_OK;
LAB_00102ffc:
  if (local_c8 != 0) {
    pCVar8 = (ChunkData *)((long)pCStack_d0 - (long)chunk_data);
    if (pCVar8 == (ChunkData *)0x0) {
      if (iStack_c0 == 0) {
        bVar23 = local_b8 == 0;
        goto joined_r0x00103f7e;
      }
      local_c8 = 0;
    }
    else {
      if (pCStack_d0 < chunk_data || pCVar8 == (ChunkData *)0x0) {
LAB_00103d99:
        bVar23 = local_b8 == 0;
        goto joined_r0x00103f7e;
      }
      pCStack_d0 = pCVar8;
    }
  }
LAB_00103036:
  uVar18 = uVar14;
  if (WVar11 != WEBP_INFO_OK) goto LAB_00103f8f;
  goto LAB_00102f17;
}

Assistant:

int main(int argc, const char* argv[]) {
  int c, quiet = 0, show_diag = 0, show_summary = 0;
  int parse_bitstream = 0;
  WebPInfoStatus webp_info_status = WEBP_INFO_OK;
  WebPInfo webp_info;

  INIT_WARGV(argc, argv);

  if (argc == 1) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Parse command-line input.
  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help") ||
        !strcmp(argv[c], "-H") || !strcmp(argv[c], "-longhelp")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-diag")) {
      show_diag = 1;
    } else if (!strcmp(argv[c], "-summary")) {
      show_summary = 1;
    } else if (!strcmp(argv[c], "-bitstream_info")) {
      parse_bitstream = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("WebP Decoder version: %d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else {  // Assume the remaining are all input files.
      break;
    }
  }

  if (c == argc) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Process input files one by one.
  for (; c < argc; ++c) {
    WebPData webp_data;
    const W_CHAR* in_file = NULL;
    WebPInfoInit(&webp_info);
    webp_info.quiet_ = quiet;
    webp_info.show_diagnosis_ = show_diag;
    webp_info.show_summary_ = show_summary;
    webp_info.parse_bitstream_ = parse_bitstream;
    in_file = GET_WARGV(argv, c);
    if (in_file == NULL ||
        !ReadFileToWebPData((const char*)in_file, &webp_data)) {
      webp_info_status = WEBP_INFO_INVALID_COMMAND;
      WFPRINTF(stderr, "Failed to open input file %s.\n", in_file);
      continue;
    }
    if (!webp_info.quiet_) WPRINTF("File: %s\n", in_file);
    webp_info_status = AnalyzeWebP(&webp_info, &webp_data);
    WebPDataClear(&webp_data);
  }
  FREE_WARGV_AND_RETURN((webp_info_status == WEBP_INFO_OK) ? EXIT_SUCCESS
                                                           : EXIT_FAILURE);
}